

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

void Curl_setup_transfer(connectdata *conn,int sockindex,curl_off_t size,_Bool getheader,
                        curl_off_t *bytecountp,int writesockindex,curl_off_t *writecountp)

{
  int *piVar1;
  Curl_easy *data;
  int iVar2;
  curl_socket_t cVar3;
  curl_socket_t cVar4;
  curltime cVar5;
  
  data = conn->data;
  if (((conn->bits).multiplex == false) && (conn->httpversion != 0x14)) {
    cVar3 = -1;
    cVar4 = -1;
    if (sockindex != -1) {
      cVar4 = conn->sock[sockindex];
    }
    conn->sockfd = cVar4;
    if (writesockindex != -1) {
      cVar3 = conn->sock[writesockindex];
    }
  }
  else {
    iVar2 = sockindex;
    if ((sockindex == -1) && (iVar2 = writesockindex, writesockindex == -1)) {
      cVar3 = -1;
    }
    else {
      cVar3 = conn->sock[iVar2];
    }
    conn->sockfd = cVar3;
  }
  conn->writesockfd = cVar3;
  (data->req).getheader = getheader;
  (data->req).size = size;
  (data->req).bytecountp = bytecountp;
  (data->req).writebytecountp = writecountp;
  if ((!getheader) && ((data->req).header = false, 0 < size)) {
    Curl_pgrsSetDownloadSize(data,size);
  }
  if (((data->req).getheader != false) || ((data->set).opt_no_body == false)) {
    if (sockindex != -1) {
      piVar1 = &(data->req).keepon;
      *(byte *)piVar1 = (byte)*piVar1 | 1;
    }
    if (writesockindex != -1) {
      if ((data->state).expect100header == true) {
        if (((conn->handler->protocol & 3) != 0) &&
           (*(int *)((long)(data->req).protop + 0x218) == 2)) {
          (data->req).exp100 = EXP100_AWAITING_CONTINUE;
          cVar5 = Curl_now();
          (data->req).start100.tv_sec = cVar5.tv_sec;
          (data->req).start100.tv_usec = cVar5.tv_usec;
          Curl_expire(data,(data->set).expect_100_timeout,EXPIRE_100_TIMEOUT);
          return;
        }
        (data->req).exp100 = EXP100_SENDING_REQUEST;
      }
      piVar1 = &(data->req).keepon;
      *(byte *)piVar1 = (byte)*piVar1 | 2;
    }
  }
  return;
}

Assistant:

void
Curl_setup_transfer(
  struct connectdata *conn, /* connection data */
  int sockindex,            /* socket index to read from or -1 */
  curl_off_t size,          /* -1 if unknown at this point */
  bool getheader,           /* TRUE if header parsing is wanted */
  curl_off_t *bytecountp,   /* return number of bytes read or NULL */
  int writesockindex,       /* socket index to write to, it may very well be
                               the same we read from. -1 disables */
  curl_off_t *writecountp   /* return number of bytes written or NULL */
  )
{
  struct Curl_easy *data;
  struct SingleRequest *k;

  DEBUGASSERT(conn != NULL);

  data = conn->data;
  k = &data->req;

  DEBUGASSERT((sockindex <= 1) && (sockindex >= -1));

  if(conn->bits.multiplex || conn->httpversion == 20) {
    /* when multiplexing, the read/write sockets need to be the same! */
    conn->sockfd = sockindex == -1 ?
      ((writesockindex == -1 ? CURL_SOCKET_BAD : conn->sock[writesockindex])) :
      conn->sock[sockindex];
    conn->writesockfd = conn->sockfd;
  }
  else {
    conn->sockfd = sockindex == -1 ?
      CURL_SOCKET_BAD : conn->sock[sockindex];
    conn->writesockfd = writesockindex == -1 ?
      CURL_SOCKET_BAD:conn->sock[writesockindex];
  }
  k->getheader = getheader;

  k->size = size;
  k->bytecountp = bytecountp;
  k->writebytecountp = writecountp;

  /* The code sequence below is placed in this function just because all
     necessary input is not always known in do_complete() as this function may
     be called after that */

  if(!k->getheader) {
    k->header = FALSE;
    if(size > 0)
      Curl_pgrsSetDownloadSize(data, size);
  }
  /* we want header and/or body, if neither then don't do this! */
  if(k->getheader || !data->set.opt_no_body) {

    if(sockindex != -1)
      k->keepon |= KEEP_RECV;

    if(writesockindex != -1) {
      struct HTTP *http = data->req.protop;
      /* HTTP 1.1 magic:

         Even if we require a 100-return code before uploading data, we might
         need to write data before that since the REQUEST may not have been
         finished sent off just yet.

         Thus, we must check if the request has been sent before we set the
         state info where we wait for the 100-return code
      */
      if((data->state.expect100header) &&
         (conn->handler->protocol&PROTO_FAMILY_HTTP) &&
         (http->sending == HTTPSEND_BODY)) {
        /* wait with write until we either got 100-continue or a timeout */
        k->exp100 = EXP100_AWAITING_CONTINUE;
        k->start100 = Curl_now();

        /* Set a timeout for the multi interface. Add the inaccuracy margin so
           that we don't fire slightly too early and get denied to run. */
        Curl_expire(data, data->set.expect_100_timeout, EXPIRE_100_TIMEOUT);
      }
      else {
        if(data->state.expect100header)
          /* when we've sent off the rest of the headers, we must await a
             100-continue but first finish sending the request */
          k->exp100 = EXP100_SENDING_REQUEST;

        /* enable the write bit when we're not waiting for continue */
        k->keepon |= KEEP_SEND;
      }
    } /* if(writesockindex != -1) */
  } /* if(k->getheader || !data->set.opt_no_body) */

}